

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O2

void __thiscall FIX::FieldMap::setField(FieldMap *this,FieldBase *field,bool overwrite)

{
  iterator this_00;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,overwrite) != 0) {
    this_00 = findTag(this,field->m_tag);
    if (this_00._M_current != *(FieldBase **)(this + 0x10)) {
      FieldBase::setString(this_00._M_current,&field->m_string);
      return;
    }
  }
  addField(this,field);
  return;
}

Assistant:

void setField( const FieldBase& field, bool overwrite = true )
  EXCEPT ( RepeatedTag )
  {
    if( !overwrite )
    {
      addField( field );
    }
    else
    {
      Fields::iterator i = findTag( field.getTag() );
      if( i == m_fields.end() )
      {
        addField( field );
      }
      else
      {
        i->setString( field.getString() );
      }
    }
  }